

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

void Abc_AigCheckFaninOrder(Abc_Aig_t *pMan)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_1c;
  Abc_Obj_t *pAStack_18;
  int i;
  Abc_Obj_t *pEnt;
  Abc_Aig_t *pMan_local;
  
  for (local_1c = 0; local_1c < pMan->nBins; local_1c = local_1c + 1) {
    for (pAStack_18 = pMan->pBins[local_1c]; pAStack_18 != (Abc_Obj_t *)0x0;
        pAStack_18 = pAStack_18->pNext) {
      pAVar2 = Abc_ObjChild0(pAStack_18);
      pAVar2 = Abc_ObjRegular(pAVar2);
      iVar1 = pAVar2->Id;
      pAVar2 = Abc_ObjChild1(pAStack_18);
      pAVar2 = Abc_ObjRegular(pAVar2);
      if (pAVar2->Id < iVar1) {
        printf("Node %d has incorrect ordering of fanins.\n",(ulong)(uint)pAStack_18->Id);
      }
    }
  }
  return;
}

Assistant:

void Abc_AigCheckFaninOrder( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pEnt;
    int i;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pEnt )
        {
            if ( Abc_ObjRegular(Abc_ObjChild0(pEnt))->Id > Abc_ObjRegular(Abc_ObjChild1(pEnt))->Id )
            {
//                int i0 = Abc_ObjRegular(Abc_ObjChild0(pEnt))->Id;
//                int i1 = Abc_ObjRegular(Abc_ObjChild1(pEnt))->Id;
                printf( "Node %d has incorrect ordering of fanins.\n", pEnt->Id );
            }
        }
}